

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::ServiceOptions::_InternalSerialize
          (ServiceOptions *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  int iVar2;
  FeatureSet *value;
  ulong uVar3;
  uint8_t *puVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>_>
  *value_00;
  int index;
  
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 2) != 0) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteBoolToArray
                       (0x21,(this->field_0)._impl_.deprecated_,puVar4);
  }
  if ((uVar1 & 1) != 0) {
    value = (this->field_0)._impl_.features_;
    target = internal::WireFormatLite::InternalWriteMessage
                       (0x22,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target
                        ,stream);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x28);
  for (index = 0; iVar2 != index; index = index + 1) {
    value_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                         (&(this->field_0)._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase,
                          index);
    target = internal::WireFormatLite::InternalWriteMessage
                       (999,(MessageLite *)value_00,(value_00->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  puVar4 = internal::ExtensionSet::_InternalSerialize
                     (&(this->field_0)._impl_._extensions_,
                      (MessageLite *)&_ServiceOptions_default_instance_,1000,0x20000000,target,
                      stream);
  uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar3 & 1) == 0) {
    return puVar4;
  }
  puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8),puVar4,stream);
  return puVar4;
}

Assistant:

::uint8_t* ServiceOptions::_InternalSerialize(
            ::uint8_t* target,
            ::google::protobuf::io::EpsCopyOutputStream* stream) const {
          const ServiceOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.ServiceOptions)
          ::uint32_t cached_has_bits = 0;
          (void)cached_has_bits;

          cached_has_bits = this_._impl_._has_bits_[0];
          // optional bool deprecated = 33 [default = false];
          if (cached_has_bits & 0x00000002u) {
            target = stream->EnsureSpace(target);
            target = ::_pbi::WireFormatLite::WriteBoolToArray(
                33, this_._internal_deprecated(), target);
          }

          // optional .google.protobuf.FeatureSet features = 34;
          if (cached_has_bits & 0x00000001u) {
            target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
                34, *this_._impl_.features_, this_._impl_.features_->GetCachedSize(), target,
                stream);
          }

          // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
          for (unsigned i = 0, n = static_cast<unsigned>(
                                   this_._internal_uninterpreted_option_size());
               i < n; i++) {
            const auto& repfield = this_._internal_uninterpreted_option().Get(i);
            target =
                ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
                    999, repfield, repfield.GetCachedSize(),
                    target, stream);
          }

          // Extension range [1000, 536870912)
          target = this_._impl_._extensions_._InternalSerialize(
              internal_default_instance(), 1000, 536870912, target, stream);
          if (PROTOBUF_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
            target =
                ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
                    this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
          }
          // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.ServiceOptions)
          return target;
        }